

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O3

void __thiscall
amrex::MLEBABecLap::setEBDirichlet
          (MLEBABecLap *this,int amrlev,MultiFab *phi,
          Vector<double,_std::allocator<double>_> *hv_beta)

{
  Location LVar1;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar2;
  pointer puVar3;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar4;
  long *plVar5;
  pointer __src;
  pointer pdVar6;
  uint ncomp;
  FabType FVar7;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var8;
  MultiFab *this_00;
  pointer *ppbVar9;
  size_t __n;
  long lVar10;
  ulong uVar11;
  size_type a_capacity;
  long lVar12;
  uint32_t *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Periodicity PVar21;
  DeviceVector<Real> dv_beta;
  MFIter mfi;
  long local_290;
  FabArray<amrex::EBCellFlagFab> *local_278;
  long local_260;
  long local_258;
  Box local_214;
  PODVector<double,_std::allocator<double>_> local_1f8;
  FabArray<amrex::FArrayBox> *local_1e0;
  ulong local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1b8;
  int local_1a0;
  Vector<int,_std::allocator<int>_> *local_188;
  long local_168;
  ulong local_160;
  long local_158;
  long local_150;
  Array4<double> local_148;
  Array4<double> local_108;
  Array4<const_double> local_c8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_1e0 = &phi->super_FabArray<amrex::FArrayBox>;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  LVar1 = this->m_phi_loc;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    bxs = *(BoxArray **)
           &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[amrlev].
            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
    dm = *(DistributionMapping **)
          &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[amrlev].
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
    ;
    local_1c8._1_7_ = 0;
    local_1c8[0] = true;
    local_1c8._8_4_ = 0;
    local_1c8._12_4_ = 0;
    vStack_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar2 = (FabFactory<amrex::FArrayBox> *)
             **(undefined8 **)
               &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         operator_new(0x180);
    MultiFab::MultiFab((MultiFab *)
                       _Var8.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,ncomp,
                       (uint)(LVar1 == CellCentroid),(MFInfo *)local_1c8,pFVar2);
    puVar3 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar4.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar3[amrlev]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar3[amrlev]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (tVar4.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar4.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_1b8);
  }
  if ((**(long **)&(this->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[amrlev].
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       == 0) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[amrlev])) {
    local_290 = 0;
    lVar10 = 0;
    lVar16 = 0;
    do {
      lVar15 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
      lVar17 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
      ;
      local_1c8._1_7_ = 0;
      local_1c8[0] = true;
      vStack_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8._8_4_ = 0;
      local_1c8._12_4_ = 0;
      vStack_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pFVar2 = *(FabFactory<amrex::FArrayBox> **)
                (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                + lVar16 * 8);
      this_00 = (MultiFab *)operator_new(0x180);
      MultiFab::MultiFab(this_00,(BoxArray *)(lVar15 + lVar10),
                         (DistributionMapping *)(lVar17 + local_290),ncomp,0,(MFInfo *)local_1c8,
                         pFVar2);
      lVar15 = *(long *)&(this->m_eb_b_coeffs).
                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      plVar5 = *(long **)(lVar15 + lVar16 * 8);
      *(MultiFab **)(lVar15 + lVar16 * 8) = this_00;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_1b8);
      lVar16 = lVar16 + 1;
      lVar10 = lVar10 + 0x68;
      local_290 = local_290 + 0x10;
    } while (lVar16 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[amrlev]);
  }
  lVar10 = **(long **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar10 == 0) {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar10 = __dynamic_cast(lVar10,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar10 != 0) {
      local_278 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar10 + 0xd8));
    }
  }
  uVar11 = (long)(hv_beta->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(hv_beta->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start >> 3;
  local_1f8.m_data = (pointer)0x0;
  local_1f8.m_size = 0;
  local_1f8.m_capacity = 0;
  a_capacity = 8;
  if (8 < uVar11) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar11);
  }
  PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_1f8,a_capacity);
  __src = (hv_beta->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)(hv_beta->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)__src;
  local_1f8.m_size = uVar11;
  if (__n != 0) {
    memcpy(local_1f8.m_data,__src,__n);
  }
  pdVar6 = local_1f8.m_data;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00717ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_1c8,&local_1e0->super_FabArrayBase,&local_44);
  if ((int)vStack_1b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1a0) {
    local_1d8 = (ulong)ncomp;
    do {
      MFIter::tilebox(&local_214,(MFIter *)local_1c8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_108,
                 (FabArray<amrex::FArrayBox> *)
                 (this->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)local_1c8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_148,
                 (FabArray<amrex::FArrayBox> *)
                 **(undefined8 **)
                   &(this->m_eb_b_coeffs).
                    super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ,(MFIter *)local_1c8);
      if (local_278 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_005d388d:
        if (0 < (int)ncomp) {
          lVar10 = (long)local_214.smallend.vect[1];
          local_258 = 0;
          uVar11 = 0;
          do {
            iVar14 = local_214.smallend.vect[2];
            if (local_214.smallend.vect[2] <= local_214.bigend.vect[2]) {
              do {
                if (local_214.smallend.vect[1] <= local_214.bigend.vect[1]) {
                  lVar17 = (long)local_148.p +
                           local_148.nstride * local_258 +
                           (lVar10 - local_148.begin.y) * local_148.jstride * 8 +
                           ((long)iVar14 - (long)local_148.begin.z) * local_148.kstride * 8 +
                           (long)local_148.begin.x * -8 + (long)local_214.smallend.vect[0] * 8;
                  lVar15 = (long)local_108.p +
                           local_108.nstride * local_258 +
                           (lVar10 - local_108.begin.y) * local_108.jstride * 8 +
                           ((long)iVar14 - (long)local_108.begin.z) * local_108.kstride * 8 +
                           (long)local_108.begin.x * -8 + (long)local_214.smallend.vect[0] * 8;
                  lVar16 = lVar10;
                  do {
                    if (local_214.smallend.vect[0] <= local_214.bigend.vect[0]) {
                      lVar12 = 0;
                      do {
                        *(undefined8 *)(lVar15 + lVar12 * 8) = 0;
                        *(undefined8 *)(lVar17 + lVar12 * 8) = 0;
                        lVar12 = lVar12 + 1;
                      } while ((local_214.bigend.vect[0] - local_214.smallend.vect[0]) + 1 !=
                               (int)lVar12);
                    }
                    lVar16 = lVar16 + 1;
                    lVar17 = lVar17 + local_148.jstride * 8;
                    lVar15 = lVar15 + local_108.jstride * 8;
                  } while (local_214.bigend.vect[1] + 1U != (int)lVar16);
                }
                bVar18 = iVar14 != local_214.bigend.vect[2];
                iVar14 = iVar14 + 1;
              } while (bVar18);
            }
            uVar11 = uVar11 + 1;
            local_258 = local_258 + 8;
          } while (uVar11 != local_1d8);
        }
      }
      else {
        ppbVar9 = &vStack_1b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_188 != (Vector<int,_std::allocator<int>_> *)0x0) {
          ppbVar9 = (pointer *)
                    ((local_188->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start +
                    (int)vStack_1b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        FVar7 = EBCellFlagFab::getType
                          ((local_278->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar9],&local_214);
        if ((uint)(FVar7 + singlevalued) < 2) goto LAB_005d388d;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_c8,local_1e0,(MFIter *)local_1c8);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_88,local_278,(MFIter *)local_1c8);
        if (0 < (int)ncomp) {
          local_160 = (ulong)(uint)local_214.bigend.vect[1];
          local_1d0 = (long)local_214.smallend.vect[1];
          local_150 = (long)local_214.smallend.vect[0];
          local_158 = local_150 * 8;
          local_168 = local_150 * 4;
          local_260 = 0;
          uVar11 = 0;
          do {
            iVar14 = local_214.smallend.vect[2];
            if (local_214.smallend.vect[2] <= local_214.bigend.vect[2]) {
              do {
                if (local_214.smallend.vect[1] <= local_214.bigend.vect[1]) {
                  lVar16 = (long)iVar14;
                  puVar13 = (uint32_t *)
                            ((long)&local_88.p
                                    [local_150 +
                                     ((lVar16 - local_88.begin.z) * local_88.kstride -
                                     (long)local_88.begin.x)].flag +
                            (local_1d0 - local_88.begin.y) * local_88.jstride * 4);
                  lVar10 = local_1d0;
                  do {
                    if (local_214.smallend.vect[0] <= local_214.bigend.vect[0]) {
                      lVar15 = local_108.nstride * local_260 +
                               (lVar16 - local_108.begin.z) * local_108.kstride * 8 +
                               (lVar10 - local_108.begin.y) * local_108.jstride * 8 +
                               (long)local_108.begin.x * -8 + local_158;
                      lVar17 = 0;
                      do {
                        if ((puVar13[lVar17] & 3) == 1) {
                          *(undefined8 *)((long)local_108.p + lVar17 * 8 + lVar15) =
                               *(undefined8 *)
                                ((long)local_c8.p +
                                lVar17 * 8 +
                                local_c8.nstride * local_260 +
                                (lVar16 - local_c8.begin.z) * local_c8.kstride * 8 +
                                (lVar10 - local_c8.begin.y) * local_c8.jstride * 8 +
                                (long)local_c8.begin.x * -8 + local_158);
                          uVar19 = SUB84(pdVar6[uVar11],0);
                          uVar20 = (undefined4)((ulong)pdVar6[uVar11] >> 0x20);
                        }
                        else {
                          *(undefined8 *)((long)local_108.p + lVar17 * 8 + lVar15) = 0;
                          uVar19 = 0;
                          uVar20 = 0;
                        }
                        *(ulong *)((long)local_148.p +
                                  lVar17 * 8 +
                                  local_148.nstride * local_260 +
                                  (lVar16 - local_148.begin.z) * local_148.kstride * 8 +
                                  (lVar10 - local_148.begin.y) * local_148.jstride * 8 +
                                  (long)local_148.begin.x * -8 + local_158) =
                             CONCAT44(uVar20,uVar19);
                        lVar17 = lVar17 + 1;
                      } while ((local_214.bigend.vect[0] - local_214.smallend.vect[0]) + 1 !=
                               (int)lVar17);
                    }
                    lVar10 = lVar10 + 1;
                    puVar13 = puVar13 + local_88.jstride;
                  } while (local_214.bigend.vect[1] + 1U != (int)lVar10);
                }
                bVar18 = iVar14 != local_214.bigend.vect[2];
                iVar14 = iVar14 + 1;
              } while (bVar18);
            }
            uVar11 = uVar11 + 1;
            local_260 = local_260 + 8;
          } while (uVar11 != local_1d8);
        }
      }
      MFIter::operator++((MFIter *)local_1c8);
    } while ((int)vStack_1b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1a0);
  }
  MFIter::~MFIter((MFIter *)local_1c8);
  if (LVar1 == CellCentroid) {
    _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar21 = Geometry::periodicity
                       (*(Geometry **)
                         &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
    local_1c8[0] = PVar21.period.vect[0]._0_1_;
    local_1c8._1_7_ = PVar21.period.vect._1_7_;
    local_1c8._8_4_ = PVar21.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Periodicity *)local_1c8,false);
  }
  if (local_1f8.m_data != (pointer)0x0) {
    operator_delete(local_1f8.m_data,local_1f8.m_capacity << 3);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Vector<Real> const& hv_beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    Gpu::DeviceVector<Real> dv_beta(hv_beta.size());
    Gpu::copy(Gpu::hostToDevice, hv_beta.begin(), hv_beta.end(), dv_beta.begin());
    Real const* beta = dv_beta.data();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta[n];
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}